

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoli.c
# Opt level: O2

int ffgsfi(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
          short *array,char *flagval,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long firstelem;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  short *array_00;
  int local_374;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  int hdutype;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  fitsfile *local_1d8;
  long local_1d0;
  long str [9];
  long dsize [10];
  long incr [9];
  long stp [9];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvi is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    iVar1 = 0x140;
  }
  else {
    iVar1 = fits_is_compressed_image(fptr,status);
    uVar10 = (ulong)(uint)naxis;
    if (iVar1 == 0) {
      iVar1 = ffghdt(fptr,&hdutype,status);
      if (iVar1 < 1) {
        if (hdutype == 0) {
          local_370 = (long)(int)(colnum + (uint)(colnum == 0));
          local_330 = 1;
          local_374 = 2;
          local_368 = local_370;
        }
        else {
          local_370 = blc[uVar10];
          local_368 = trc[uVar10];
          local_330 = inc[uVar10];
          local_374 = colnum;
        }
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        lVar4 = 1;
        for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
          str[lVar3] = 1;
          stp[lVar3] = 1;
          incr[lVar3] = 1;
          dsize[lVar3] = 1;
        }
        for (; local_1d8 = fptr, lVar4 - uVar10 != 1; lVar4 = lVar4 + 1) {
          lVar3 = trc[lVar4 + -1];
          if (lVar3 < blc[lVar4 + -1]) {
            snprintf((char *)blcll,0x51,"ffgsvi: illegal range specified for axis %ld");
            ffpmsg((char *)blcll);
            *status = 0x141;
            return 0x141;
          }
          str[lVar4 + -1] = blc[lVar4 + -1];
          stp[lVar4 + -1] = lVar3;
          dsize[lVar4 + 9] = inc[lVar4 + -1];
          dsize[lVar4] = naxes[lVar4 + -1] * dsize[lVar4 + -1];
        }
        if ((naxis == 1) && (*naxes == 1)) {
          lVar4 = (local_368 - local_370) / local_330;
          local_368 = local_370;
          local_320 = local_330;
        }
        else {
          lVar4 = (stp[0] - str[0]) / *inc;
          local_320 = incr[0];
        }
        local_250 = str[8];
        local_258 = str[7];
        local_260 = str[6];
        local_248 = str[5];
        local_240 = str[4];
        local_230 = str[2];
        local_268 = (str[1] + -1) * dsize[1] + (str[2] + -1) * dsize[2] +
                    (str[3] + -1) * dsize[3] + (str[4] + -1) * dsize[4] + (str[5] + -1) * dsize[5] +
                    (str[6] + -1) * dsize[6] + (str[7] + -1) * dsize[7] +
                    (str[8] + -1) * dsize[8] + str[0];
        local_318 = incr[8];
        local_310 = dsize[8] * incr[8];
        local_308 = incr[7];
        local_300 = dsize[7] * incr[7];
        local_2f8 = incr[6];
        local_2f0 = dsize[6] * incr[6];
        local_2e8 = incr[5];
        local_2e0 = dsize[5] * incr[5];
        local_2d8 = incr[4];
        local_2d0 = dsize[4] * incr[4];
        local_2c8 = incr[3];
        local_2c0 = dsize[3] * incr[3];
        local_298 = incr[2];
        local_288 = dsize[2] * incr[2];
        local_1e0 = incr[1];
        local_1e8 = lVar4 * 2 + 2;
        local_220 = stp[8];
        local_228 = stp[7];
        local_218 = stp[6];
        local_210 = stp[5];
        local_208 = stp[4];
        local_200 = stp[3];
        local_1d0 = stp[1];
        lVar11 = 0;
        lVar3 = str[1];
        for (; local_370 <= local_368; local_370 = local_370 + local_330) {
          local_358 = local_268;
          local_2b8 = str[3];
          local_2a0 = stp[2];
          local_290 = lVar3;
          for (lVar5 = local_250; lVar5 <= local_220; lVar5 = lVar5 + local_318) {
            local_360 = local_358;
            local_2a8 = lVar5;
            for (lVar6 = local_258; lVar6 <= local_228; lVar6 = lVar6 + local_308) {
              local_350 = local_360;
              local_2b0 = lVar6;
              for (lVar7 = local_260; lVar7 <= local_218; lVar7 = lVar7 + local_2f8) {
                local_348 = local_350;
                local_280 = lVar7;
                for (lVar8 = local_248; lVar8 <= local_210; lVar8 = lVar8 + local_2e8) {
                  local_340 = local_348;
                  local_278 = lVar8;
                  for (lVar9 = local_240; lVar9 <= local_208; lVar9 = lVar9 + local_2d8) {
                    local_338 = local_340;
                    local_270 = lVar9;
                    for (local_238 = str[3]; local_1f8 = local_230, firstelem = local_338,
                        local_238 <= local_200; local_238 = local_238 + local_2c8) {
                      for (; local_1f8 <= stp[2]; local_1f8 = local_1f8 + local_298) {
                        array_00 = array + lVar11;
                        local_1f0 = firstelem;
                        for (; lVar3 <= local_1d0; lVar3 = lVar3 + local_1e0) {
                          iVar1 = ffgcli(local_1d8,local_374,local_370,firstelem,lVar4 + 1,local_320
                                         ,2,0,array_00,flagval + lVar11,(int *)blcll,status);
                          if (0 < iVar1) goto LAB_0018bd98;
                          if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                            *anynul = 1;
                          }
                          lVar11 = lVar11 + lVar4 + 1;
                          firstelem = firstelem + dsize[1] * incr[1];
                          array_00 = (short *)((long)array_00 + local_1e8);
                        }
                        stp[2] = local_2a0;
                        lVar5 = local_2a8;
                        firstelem = local_1f0 + local_288;
                        lVar3 = local_290;
                        lVar6 = local_2b0;
                        lVar7 = local_280;
                        lVar8 = local_278;
                        lVar9 = local_270;
                      }
                      local_338 = local_338 + local_2c0;
                      str[3] = local_2b8;
                    }
                    local_340 = local_340 + local_2d0;
                  }
                  local_348 = local_348 + local_2e0;
                }
                local_350 = local_350 + local_2f0;
              }
              local_360 = local_360 + local_300;
            }
            local_358 = local_358 + local_310;
          }
        }
      }
LAB_0018bd98:
      iVar1 = *status;
    }
    else {
      for (uVar2 = 0; uVar10 != uVar2; uVar2 = uVar2 + 1) {
        blcll[uVar2] = blc[uVar2];
        dsize[uVar2] = trc[uVar2];
      }
      fits_read_compressed_img(fptr,0x15,blcll,dsize,inc,2,(void *)0x0,array,flagval,anynul,status);
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffgsfi(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           short *array,   /* O - array to be filled and returned           */
           char *flagval,  /* O - set to 1 if corresponding value is null   */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dsize[10];
    LONGLONG blcll[9], trcll[9];
    long felem, nelem, nultyp, ninc, numcol;
    int hdutype, anyf;
    short nulval = 0;
    char msg[FLEN_ERRMSG];
    int nullcheck = 2;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvi is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        fits_read_compressed_img(fptr, TSHORT, blcll, trcll, inc,
            nullcheck, NULL, array, flagval, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 2;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvi: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];

              if ( ffgcli(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &flagval[i0], &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}